

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketParser.cpp
# Opt level: O1

void __thiscall
PacketParser::subValues(PacketParser *this,int key,string *value,__ItemValueType value_type)

{
  float fVar1;
  int iVar2;
  long lVar3;
  ItemInfo **ppIVar4;
  ItemInfo *pIVar5;
  int *piVar6;
  UnsupportedOperationException *pUVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  char *__nptr;
  float fVar13;
  string local_50;
  
  if (value_type == IVT_INT) {
    iVar2 = (this->data).m_size;
    lVar3 = (long)iVar2;
    iVar9 = -1;
    if (0 < lVar3) {
      lVar11 = 0;
      do {
        if (((this->data).m_items[lVar11]->m_value).index == key) {
          iVar9 = (int)lVar11;
          break;
        }
        lVar11 = lVar11 + 1;
      } while (lVar3 != lVar11);
    }
    if (iVar9 == -1) {
      pIVar5 = (ItemInfo *)0x0;
    }
    else {
      pIVar5 = (this->data).m_items[iVar9];
    }
    if (pIVar5 == (ItemInfo *)0x0) {
      (this->data).m_size = iVar2 + 1;
      ppIVar4 = (ItemInfo **)realloc((this->data).m_items,lVar3 * 8 + 8);
      (this->data).m_items = ppIVar4;
      pIVar5 = (ItemInfo *)operator_new(0x28);
      (pIVar5->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_0010ab48;
      *(undefined8 *)&pIVar5->m_value = 0;
      (pIVar5->m_value).name = (char *)0x0;
      *(undefined8 *)&(pIVar5->m_value).type = 0;
      (pIVar5->m_value).field_3.eValue = 0.0;
      (pIVar5->m_value).index = -1;
      ppIVar4[(long)(this->data).m_size + -1] = pIVar5;
      (pIVar5->m_value).index = key;
    }
    pIVar5 = ItemInfo::operator[](pIVar5,"value");
    iVar2 = (pIVar5->m_value).field_3.iValue;
    __nptr = (value->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar9 = *piVar6;
    *piVar6 = 0;
    lVar3 = strtol(__nptr,(char **)&local_50,10);
    if (local_50._M_dataplus._M_p != __nptr) {
      if (((int)lVar3 == lVar3) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar9;
        }
        iVar9 = (this->data).m_size;
        lVar11 = (long)iVar9;
        iVar10 = -1;
        if (0 < lVar11) {
          lVar12 = 0;
          do {
            if (((this->data).m_items[lVar12]->m_value).index == key) {
              iVar10 = (int)lVar12;
              break;
            }
            lVar12 = lVar12 + 1;
          } while (lVar11 != lVar12);
        }
        if (iVar10 == -1) {
          pIVar5 = (ItemInfo *)0x0;
        }
        else {
          pIVar5 = (this->data).m_items[iVar10];
        }
        if (pIVar5 == (ItemInfo *)0x0) {
          (this->data).m_size = iVar9 + 1;
          ppIVar4 = (ItemInfo **)realloc((this->data).m_items,lVar11 * 8 + 8);
          (this->data).m_items = ppIVar4;
          pIVar5 = (ItemInfo *)operator_new(0x28);
          (pIVar5->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_0010ab48;
          *(undefined8 *)&pIVar5->m_value = 0;
          (pIVar5->m_value).name = (char *)0x0;
          *(undefined8 *)&(pIVar5->m_value).type = 0;
          (pIVar5->m_value).field_3.eValue = 0.0;
          (pIVar5->m_value).index = -1;
          ppIVar4[(long)(this->data).m_size + -1] = pIVar5;
          (pIVar5->m_value).index = key;
        }
        pIVar5 = ItemInfo::operator[](pIVar5,"value");
        (*(pIVar5->super__Gen)._vptr__Gen[2])(pIVar5);
        (pIVar5->m_value).type = IVT_INT;
        (pIVar5->m_value).field_3.iValue = iVar2 - (int)lVar3;
        return;
      }
      goto LAB_001059b8;
    }
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (value_type != IVT_FLOAT) {
      if (value_type == IVT_STRING) {
        pUVar7 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Subtraction of strings is unsupported!","");
        UnsupportedOperationException::UnsupportedOperationException
                  (pUVar7,&local_50,(char)key,IVT_STRING);
        __cxa_throw(pUVar7,&UnsupportedOperationException::typeinfo,
                    UnsupportedOperationException::~UnsupportedOperationException);
      }
      pUVar7 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Unsupported substraction on unknown type.","");
      UnsupportedOperationException::UnsupportedOperationException
                (pUVar7,&local_50,(char)key,value_type);
      __cxa_throw(pUVar7,&UnsupportedOperationException::typeinfo,
                  UnsupportedOperationException::~UnsupportedOperationException);
    }
    iVar2 = (this->data).m_size;
    lVar3 = (long)iVar2;
    iVar9 = -1;
    if (0 < lVar3) {
      lVar11 = 0;
      do {
        if (((this->data).m_items[lVar11]->m_value).index == key) {
          iVar9 = (int)lVar11;
          break;
        }
        lVar11 = lVar11 + 1;
      } while (lVar3 != lVar11);
    }
    if (iVar9 == -1) {
      pIVar5 = (ItemInfo *)0x0;
    }
    else {
      pIVar5 = (this->data).m_items[iVar9];
    }
    if (pIVar5 == (ItemInfo *)0x0) {
      (this->data).m_size = iVar2 + 1;
      ppIVar4 = (ItemInfo **)realloc((this->data).m_items,lVar3 * 8 + 8);
      (this->data).m_items = ppIVar4;
      pIVar5 = (ItemInfo *)operator_new(0x28);
      (pIVar5->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_0010ab48;
      *(undefined8 *)&pIVar5->m_value = 0;
      (pIVar5->m_value).name = (char *)0x0;
      *(undefined8 *)&(pIVar5->m_value).type = 0;
      (pIVar5->m_value).field_3.eValue = 0.0;
      (pIVar5->m_value).index = -1;
      ppIVar4[(long)(this->data).m_size + -1] = pIVar5;
      (pIVar5->m_value).index = key;
    }
    pIVar5 = ItemInfo::operator[](pIVar5,"value");
    fVar1 = (pIVar5->m_value).field_3.fValue;
    __nptr = (value->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    *piVar6 = 0;
    fVar13 = strtof(__nptr,(char **)&local_50);
    if (local_50._M_dataplus._M_p != __nptr) {
      if (*piVar6 != 0) {
        if (*piVar6 != 0x22) goto LAB_00105772;
        fVar13 = (float)std::__throw_out_of_range("stof");
      }
      *piVar6 = iVar2;
LAB_00105772:
      iVar2 = (this->data).m_size;
      lVar3 = (long)iVar2;
      iVar9 = -1;
      if (0 < lVar3) {
        lVar11 = 0;
        do {
          if (((this->data).m_items[lVar11]->m_value).index == key) {
            iVar9 = (int)lVar11;
            break;
          }
          lVar11 = lVar11 + 1;
        } while (lVar3 != lVar11);
      }
      if (iVar9 == -1) {
        pIVar5 = (ItemInfo *)0x0;
      }
      else {
        pIVar5 = (this->data).m_items[iVar9];
      }
      if (pIVar5 == (ItemInfo *)0x0) {
        (this->data).m_size = iVar2 + 1;
        ppIVar4 = (ItemInfo **)realloc((this->data).m_items,lVar3 * 8 + 8);
        (this->data).m_items = ppIVar4;
        pIVar5 = (ItemInfo *)operator_new(0x28);
        (pIVar5->super__Gen)._vptr__Gen = (_func_int **)&PTR__ItemInfo_0010ab48;
        *(undefined8 *)&pIVar5->m_value = 0;
        (pIVar5->m_value).name = (char *)0x0;
        *(undefined8 *)&(pIVar5->m_value).type = 0;
        (pIVar5->m_value).field_3.eValue = 0.0;
        (pIVar5->m_value).index = -1;
        ppIVar4[(long)(this->data).m_size + -1] = pIVar5;
        (pIVar5->m_value).index = key;
      }
      pIVar5 = ItemInfo::operator[](pIVar5,"value");
      (*(pIVar5->super__Gen)._vptr__Gen[2])(pIVar5);
      (pIVar5->m_value).type = IVT_FLOAT;
      (pIVar5->m_value).field_3.fValue = fVar1 - fVar13;
      return;
    }
  }
  std::__throw_invalid_argument("stof");
LAB_001059b8:
  uVar8 = std::__throw_out_of_range("stoi");
  if (local_50._M_dataplus._M_p != __nptr) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((char)piVar6 != '\0') {
    __cxa_free_exception(this);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

void	PacketParser::subValues(const int key, const std::string &value, const __ItemValueType value_type)
{
	if (value_type == IVT_INT)
	{
		int result = data[key]["value"].get_value().iValue - std::stoi(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_FLOAT)
	{
		float result = data[key]["value"].get_value().fValue - std::stof(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_STRING)
		throw UnsupportedOperationException("Subtraction of strings is unsupported!", key, value_type);
	else
		throw UnsupportedOperationException("Unsupported substraction on unknown type.", key, value_type);
}